

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  stbrp_node **ppsVar6;
  stbrp_context *psVar7;
  int iVar8;
  stbrp_rect *psVar9;
  stbrp_rect *extraout_RAX;
  stbrp_rect *extraout_RAX_00;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  stbrp_context *psVar13;
  stbrp_node **ppsVar14;
  stbrp_node *psVar15;
  stbrp_node *psVar16;
  ulong uVar17;
  stbrp_node **in_R8;
  stbrp_node *psVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  stbrp_context *c;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  int waste;
  int local_a8;
  uint local_a4;
  stbrp_node **local_a0;
  int local_90;
  int local_8c;
  stbrp_context *local_88;
  ulong local_80;
  stbrp_rect *local_78;
  stbrp_node **local_70;
  stbrp_node *local_68;
  stbrp_rect *local_60;
  stbrp_rect *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  stbrp_rect *local_38;
  long lVar27;
  
  auVar5 = _DAT_0017b730;
  uVar21 = (ulong)(uint)num_rects;
  uVar23 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar27 = uVar23 - 1;
    auVar25._8_4_ = (int)lVar27;
    auVar25._0_8_ = lVar27;
    auVar25._12_4_ = (int)((ulong)lVar27 >> 0x20);
    piVar10 = &rects[1].was_packed;
    uVar12 = 0;
    auVar25 = auVar25 ^ _DAT_0017b730;
    auVar26 = _DAT_0017ec10;
    do {
      auVar28 = auVar26 ^ auVar5;
      if ((bool)(~(auVar28._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar28._0_4_ ||
                  auVar25._4_4_ < auVar28._4_4_) & 1)) {
        piVar10[-4] = (int)uVar12;
      }
      if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
          auVar28._12_4_ <= auVar25._12_4_) {
        *piVar10 = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar27 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar27 + 2;
      piVar10 = piVar10 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar12);
  }
  psVar9 = (stbrp_rect *)(long)num_rects;
  local_78 = psVar9;
  if (1 < (uint)num_rects) {
    qsort(rects,(size_t)psVar9,0x10,rect_height_compare);
    psVar9 = extraout_RAX;
  }
  if (0 < num_rects) {
    local_70 = &context->active_head;
    uVar12 = 0;
    local_88 = context;
    local_48 = uVar21;
    local_40 = uVar23;
    local_38 = rects;
    do {
      psVar1 = rects + uVar12;
      uVar2 = rects[uVar12].w;
      psVar9 = (stbrp_rect *)(ulong)uVar2;
      if (uVar2 == 0) {
LAB_0013442c:
        psVar1->x = 0;
        psVar1->y = 0;
        local_a0 = in_R8;
      }
      else {
        uVar3 = psVar1->h;
        uVar17 = (ulong)uVar3;
        local_80 = uVar17;
        if (uVar3 == 0) goto LAB_0013442c;
        iVar11 = context->width;
        iVar19 = (uint)uVar2 + context->align + -1;
        iVar19 = iVar19 - iVar19 % context->align;
        local_60 = psVar9;
        local_58 = psVar1;
        local_50 = uVar12;
        if (iVar11 < iVar19) {
LAB_00134422:
          local_a0 = (stbrp_node **)0x0;
          psVar9 = (stbrp_rect *)0x0;
        }
        else {
          iVar4 = context->height;
          local_80._0_4_ = (uint)uVar3;
          if (iVar4 < (int)(uint)local_80) goto LAB_00134422;
          c = (stbrp_context *)*local_70;
          uVar2 = (ushort)c->width;
          psVar15 = (stbrp_node *)(ulong)uVar2;
          local_68 = psVar15;
          if (iVar11 < (int)(iVar19 + (uint)uVar2)) {
            local_a8 = 0x40000000;
            iVar22 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
          }
          else {
            iVar22 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
            local_a8 = 0x40000000;
            ppsVar14 = local_70;
            psVar13 = c;
            do {
              iVar8 = stbrp__skyline_find_min_y(psVar13,psVar15,iVar19,(int)&local_8c,(int *)in_R8);
              if (local_88->heuristic == 0) {
                if (iVar8 < iVar22) {
                  local_a0 = ppsVar14;
                  iVar22 = iVar8;
                }
              }
              else if (((int)local_80 + iVar8 <= iVar4) &&
                      ((iVar8 < iVar22 || ((iVar8 == iVar22 && (local_8c < local_a8)))))) {
                local_a8 = local_8c;
                local_a0 = ppsVar14;
                iVar22 = iVar8;
              }
              ppsVar14 = (stbrp_node **)&psVar13->align;
              uVar2 = (ushort)(*(stbrp_context **)&psVar13->align)->width;
              psVar15 = (stbrp_node *)(ulong)uVar2;
              psVar13 = *(stbrp_context **)&psVar13->align;
            } while ((int)(iVar19 + (uint)uVar2) <= iVar11);
          }
          if (local_a0 == (stbrp_node **)0x0) {
            local_a4 = 0;
          }
          else {
            local_a4 = (uint)(*local_a0)->x;
          }
          if (local_88->heuristic == 1) {
            uVar20 = (uint)local_68;
            psVar13 = c;
            while (ppsVar14 = local_70, (int)uVar20 < iVar19) {
              psVar13 = *(stbrp_context **)&psVar13->align;
              uVar20 = (uint)(ushort)psVar13->width;
            }
            do {
              uVar20 = (uint)(ushort)psVar13->width - iVar19;
              ppsVar6 = ppsVar14;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar14 = ppsVar6;
                ppsVar6 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar20);
              iVar11 = stbrp__skyline_find_min_y
                                 (c,(stbrp_node *)(ulong)uVar20,iVar19,(int)&local_90,(int *)in_R8);
              if ((((int)local_80 + iVar11 <= iVar4) && (iVar11 <= iVar22)) &&
                 (((iVar11 < iVar22 || (local_90 < local_a8)) ||
                  ((local_90 == local_a8 && ((int)uVar20 < (int)local_a4)))))) {
                local_a8 = local_90;
                local_a4 = uVar20;
                local_a0 = ppsVar14;
                iVar22 = iVar11;
              }
              psVar13 = *(stbrp_context **)&psVar13->align;
            } while (psVar13 != (stbrp_context *)0x0);
          }
          psVar9 = (stbrp_rect *)CONCAT44(iVar22,local_a4);
          context = local_88;
          uVar21 = local_48;
          rects = local_38;
          uVar23 = local_40;
        }
        uVar12 = local_50;
        if (((local_a0 == (stbrp_node **)0x0) ||
            (iVar11 = (int)local_80 + (int)((ulong)psVar9 >> 0x20), context->height < iVar11)) ||
           (psVar15 = context->free_head, psVar15 == (stbrp_node *)0x0)) {
          local_58->x = 0xffff;
          local_58->y = 0xffff;
          psVar9 = local_58;
        }
        else {
          psVar15->x = (stbrp_coord)psVar9;
          psVar15->y = (stbrp_coord)iVar11;
          context->free_head = psVar15->next;
          psVar18 = *local_a0;
          iVar11 = (int)psVar9;
          psVar16 = psVar18;
          if ((int)(uint)psVar18->x < iVar11) {
            psVar16 = psVar18->next;
            local_a0 = &psVar18->next;
          }
          *local_a0 = psVar15;
          if (psVar16->next != (stbrp_node *)0x0) {
            local_a0 = &psVar16->next;
            psVar18 = psVar16->next;
            do {
              if (iVar11 + (int)local_60 < (int)(uint)psVar18->x) break;
              *local_a0 = context->free_head;
              context->free_head = psVar16;
              local_a0 = &psVar18->next;
              ppsVar14 = &psVar18->next;
              psVar16 = psVar18;
              psVar18 = *ppsVar14;
            } while (*ppsVar14 != (stbrp_node *)0x0);
          }
          psVar15->next = psVar16;
          iVar11 = (int)local_60 + iVar11;
          if ((int)(uint)psVar16->x < iVar11) {
            psVar16->x = (stbrp_coord)iVar11;
          }
          local_58->x = (stbrp_coord)psVar9;
          local_58->y = (stbrp_coord)((ulong)psVar9 >> 0x20);
        }
      }
      num_rects = (int)uVar21;
      uVar12 = uVar12 + 1;
      in_R8 = local_a0;
    } while (uVar12 != uVar23);
  }
  if (1 < (uint)num_rects) {
    qsort(rects,(size_t)local_78,0x10,rect_original_order);
    psVar9 = extraout_RAX_00;
  }
  if (0 < num_rects) {
    psVar9 = (stbrp_rect *)0x0;
    do {
      bVar24 = true;
      if (*(short *)((long)&rects->x + (long)psVar9) == -1) {
        bVar24 = *(short *)((long)&rects->y + (long)psVar9) != -1;
      }
      *(uint *)((long)&rects->was_packed + (long)psVar9) = (uint)bVar24;
      psVar9 = psVar9 + 1;
    } while ((stbrp_rect *)(uVar23 * 0x10) != psVar9);
  }
  return (int)psVar9;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}